

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HMAC_DRBG.c
# Opt level: O0

uint32_t Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_hash_alg a)

{
  uint32_t local_c;
  Spec_Hash_Definitions_hash_alg a_local;
  
  switch(a) {
  case '\x01':
    local_c = 0x20;
    break;
  case '\x02':
    local_c = 0x20;
    break;
  case '\x03':
    local_c = 0x20;
    break;
  case '\x04':
    local_c = 0x10;
    break;
  default:
    fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_HMAC_DRBG.c"
            ,0x41);
    exit(0xfd);
  }
  return local_c;
}

Assistant:

uint32_t Hacl_HMAC_DRBG_min_length(Spec_Hash_Definitions_hash_alg a)
{
  switch (a)
  {
    case Spec_Hash_Definitions_SHA1:
      {
        return 16U;
      }
    case Spec_Hash_Definitions_SHA2_256:
      {
        return 32U;
      }
    case Spec_Hash_Definitions_SHA2_384:
      {
        return 32U;
      }
    case Spec_Hash_Definitions_SHA2_512:
      {
        return 32U;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
}